

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

Program __thiscall Pass1::run(Pass1 *this,char *file_name)

{
  char *path_00;
  Function *pFVar1;
  mapped_type *ppFVar2;
  Type *return_type;
  mapped_type *ppFVar3;
  Block *destination_block;
  Block *source_block;
  Function *extraout_RDX;
  Program PVar4;
  Function *new_function;
  FunctionTableKey new_key;
  FunctionTable function_table;
  path local_c8;
  path local_a0;
  undefined1 local_78 [8];
  string path;
  FileTable file_table;
  Program old_program;
  char *file_name_local;
  Program *new_program;
  
  old_program.last = (Function *)file_name;
  Program::Program((Program *)&file_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
         *)((long)&path.field_2 + 8));
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_c8,(char **)&old_program.last,auto_format);
  std::filesystem::__cxx11::path::lexically_normal();
  std::filesystem::__cxx11::path::string((string *)local_78,&local_a0);
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::filesystem::__cxx11::path::~path(&local_c8);
  path_00 = (char *)std::__cxx11::string::c_str();
  pFVar1 = MoebiusParser::parse_program
                     (path_00,(Program *)
                              &file_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ppFVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
                          *)((long)&path.field_2 + 8),(key_type *)local_78);
  *ppFVar2 = pFVar1;
  Program::Program((Program *)this);
  std::
  map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::map((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
         *)&new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  ppFVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
                          *)((long)&path.field_2 + 8),(key_type *)local_78);
  FunctionTableKey::FunctionTableKey((FunctionTableKey *)&new_function,*ppFVar2);
  pFVar1 = (Function *)operator_new(0x60);
  return_type = TypeInterner::get_void_type();
  Function::Function(pFVar1,return_type);
  Program::add_function((Program *)this,pFVar1);
  ppFVar3 = std::
            map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
            ::operator[]((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
                          *)&new_key.argument_types.
                             super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(key_type *)&new_function);
  *ppFVar3 = pFVar1;
  destination_block = Function::get_block(pFVar1);
  source_block = Function::get_block(new_function);
  evaluate((Program *)&file_table._M_t._M_impl.super__Rb_tree_header._M_node_count,(Program *)this,
           (FileTable *)((long)&path.field_2 + 8),
           (FunctionTable *)
           &new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage,(FunctionTableKey *)&new_function,
           destination_block,source_block);
  FunctionTableKey::~FunctionTableKey((FunctionTableKey *)&new_function);
  std::
  map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::~map((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
          *)&new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_78);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
          *)((long)&path.field_2 + 8));
  Program::~Program((Program *)&file_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PVar4.last = extraout_RDX;
  PVar4.first = (Function *)this;
  return PVar4;
}

Assistant:

static Program run(const char* file_name) {
		Program old_program;
		FileTable file_table;
		const std::string path = std::filesystem::path(file_name).lexically_normal().string();
		file_table[path] = MoebiusParser::parse_program(path.c_str(), &old_program);
		Program new_program;
		FunctionTable function_table;
		FunctionTableKey new_key(file_table[path]);
		Function* new_function = new Function(TypeInterner::get_void_type());
		new_program.add_function(new_function);
		function_table[new_key] = new_function;
		evaluate(&old_program, &new_program, file_table, function_table, new_key, new_function->get_block(), new_key.old_function->get_block());
		return new_program;
	}